

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
                *prod,Matrix<double,__1,_1,_0,__1,_1> *dest,Scalar *alpha)

{
  PointerArgType pdVar1;
  Index IVar2;
  double *pdVar3;
  Index lhsStride;
  Scalar *lhs;
  Index cols;
  Index rows;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  size_t size;
  _LhsNested *p_Var4;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  _RhsNested *p_Var5;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  ulong uVar6;
  Index IVar7;
  Index rhsIncr;
  Scalar *pSVar8;
  Scalar SVar9;
  Scalar SVar10;
  Scalar SStack_1e8;
  PointerArgType local_1e0;
  Index local_1d8;
  PointerArgType local_1d0;
  Index local_1c8;
  Index local_1c0;
  double *local_1b8;
  Index local_1b0;
  Scalar *local_1a8;
  Index local_1a0;
  Index local_198;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_190;
  PointerArgType local_188;
  Index local_180;
  PointerArgType local_178;
  Index local_170;
  double *local_168;
  size_t local_160;
  double *local_158;
  Scalar *local_150;
  Scalar *local_148;
  Scalar *local_140;
  Scalar *local_138;
  Scalar *local_130;
  Scalar local_128;
  double local_120;
  Stride<0,_0> local_112;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_110;
  Stride<0,_0> local_f2;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_f0;
  ScalarMultipleReturnType local_d8;
  Stride<0,_0> local_b2;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_b0;
  Stride<0,_0> local_96 [7];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_88;
  undefined1 local_70 [8];
  aligned_stack_memory_handler<double> actualDestPtr_stack_memory_destructor;
  ResScalar *actualDestPtr;
  RhsScalar compatibleAlpha;
  bool evalToDest;
  bool alphaIsCompatible;
  double dStack_40;
  gemv_static_vector_if<double,__1,__1,_false> static_dest;
  ResScalar actualAlpha;
  ActualRhsType actualRhs;
  ActualLhsType actualLhs;
  Scalar *alpha_local;
  Matrix<double,__1,_1,_0,__1,_1> *dest_local;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
  *prod_local;
  
  p_Var4 = ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                );
  this = &blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(p_Var4)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                );
  this_00 = &blas_traits<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::extract(p_Var5)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  local_128 = *alpha;
  p_Var4 = ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                );
  SVar9 = blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extractScalarFactor(p_Var4);
  local_120 = local_128 * SVar9;
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                );
  SVar10 = blas_traits<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::extractScalarFactor(p_Var5);
  dStack_40 = local_120 * SVar10;
  compatibleAlpha._6_1_ = 1;
  compatibleAlpha._5_1_ = 1;
  actualDestPtr = (ResScalar *)get_factor<double,_double>::run(&stack0xffffffffffffffc0);
  uVar6 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
  if (0x1fffffffffffffff < uVar6) {
    throw_std_bad_alloc();
  }
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    local_130 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    local_130 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                          (&dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  }
  if (local_130 == (Scalar *)0x0) {
    IVar7 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
    pSVar8 = &SStack_1e8;
    if ((ulong)(IVar7 * 8) < 0x20001) {
      IVar7 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      pSVar8 = (Scalar *)((long)&SStack_1e8 - (IVar7 * 8 + 0xfU & 0xfffffffffffffff0));
      local_148 = pSVar8;
    }
    else {
      IVar7 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      local_148 = (Scalar *)aligned_malloc(IVar7 << 3);
    }
    local_140 = local_148;
  }
  else {
    if ((compatibleAlpha._5_1_ & 1) == 0) {
      local_138 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                            ((gemv_static_vector_if<double,__1,__1,_false> *)
                             ((long)&compatibleAlpha + 7));
    }
    else {
      local_138 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                            (&dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    }
    pSVar8 = &SStack_1e8;
    local_140 = local_138;
  }
  actualDestPtr_stack_memory_destructor._16_8_ = local_140;
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    *(undefined8 *)((long)pSVar8 + -8) = 0x10be39;
    local_150 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    *(undefined8 *)((long)pSVar8 + -8) = 0x10be27;
    local_150 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                          (&dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  }
  if (local_150 == (Scalar *)0x0) {
    local_158 = (double *)actualDestPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_158 = (double *)0x0;
  }
  local_168 = local_158;
  *(undefined8 *)((long)pSVar8 + -8) = 0x10be7c;
  local_160 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10be8c;
  IVar7 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
  size = local_160;
  pdVar3 = local_168;
  *(undefined8 *)((long)pSVar8 + -8) = 0x10beb6;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_70,pdVar3,size,
             0x20000 < (ulong)(IVar7 * 8));
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_178 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bede;
      local_170 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bef3;
      Stride<0,_0>::Stride(local_96);
      IVar2 = local_170;
      pdVar1 = local_178;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bf13;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_88,pdVar1,IVar2,local_96);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bf1e;
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
               *)&local_88);
      actualDestPtr = (ResScalar *)0x3ff0000000000000;
    }
    else {
      local_188 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      local_190 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bf6d;
      local_180 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bf82;
      Stride<0,_0>::Stride(&local_b2);
      IVar2 = local_180;
      pdVar1 = local_188;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bfa5;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_b0,pdVar1,IVar2,&local_b2);
      other = local_190;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10bfba;
      Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>> *)&local_b0,other);
    }
  }
  *(undefined8 *)((long)pSVar8 + -8) = 0x10bfc9;
  local_198 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(this);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10bfdb;
  local_1a0 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(this);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10bfed;
  local_1a8 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data(this);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10bfff;
  local_1b0 = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)this);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10c011;
  local_1b8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data(this_00);
  *(undefined8 *)((long)pSVar8 + -8) = 0x10c023;
  rhsIncr = Matrix<double,_-1,_1,_0,_-1,_1>::innerStride((Matrix<double,__1,_1,_0,__1,_1> *)this_00)
  ;
  rows = local_198;
  cols = local_1a0;
  lhs = local_1a8;
  lhsStride = local_1b0;
  pdVar3 = local_1b8;
  local_1c0 = rhsIncr;
  *(undefined8 *)((long)pSVar8 + -0x10) = actualDestPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)pSVar8 + -8) = 1;
  *(undefined8 *)((long)pSVar8 + -0x18) = 0x10c076;
  general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
            (rows,cols,lhs,lhsStride,pdVar3,rhsIncr,*(ResScalar **)((long)pSVar8 + -0x10),
             *(long *)((long)pSVar8 + -8),(double)actualDestPtr);
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_1d0 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c0a0;
      local_1c8 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c0b5;
      Stride<0,_0>::Stride(&local_f2);
      IVar2 = local_1c8;
      pdVar1 = local_1d0;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c0d8;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_f0,pdVar1,IVar2,&local_f2);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c0f1;
      operator*(&local_d8,&stack0xffffffffffffffc0,(StorageBaseType *)&local_f0);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c103;
      MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)dest,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_d8);
    }
    else {
      local_1e0 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c11b;
      local_1d8 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c130;
      Stride<0,_0>::Stride(&local_112);
      IVar2 = local_1d8;
      pdVar1 = local_1e0;
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c153;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_110,pdVar1,IVar2,&local_112);
      *(undefined8 *)((long)pSVar8 + -8) = 0x10c165;
      Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)dest,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
                  *)&local_110);
    }
  }
  *(undefined8 *)((long)pSVar8 + -8) = 0x10c174;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_70);
  return;
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }